

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

int js_create_module_function(JSContext *ctx,JSModuleDef *m)

{
  byte bVar1;
  JSExportEntry *pJVar2;
  int *piVar3;
  int64_t iVar4;
  JSValue v;
  int iVar5;
  JSVarRef *pJVar6;
  JSValueUnion JVar7;
  void *pvVar8;
  long lVar9;
  JSRefCountHeader *p;
  long lVar10;
  JSValue v_00;
  
  if (m->field_0x81 != '\0') {
    return 0;
  }
  if (m->init_func == (JSModuleInitFunc *)0x0) {
    piVar3 = (int *)(m->func_obj).u.ptr;
    iVar4 = (m->func_obj).tag;
    v = m->func_obj;
    v_00 = JS_NewObjectProtoClass(ctx,ctx->function_proto,0xd);
    JVar7 = v_00.u;
    if ((uint)v_00.tag == 6) {
      return -1;
    }
    *(int **)((long)JVar7.ptr + 0x30) = piVar3;
    *piVar3 = *piVar3 + 1;
    ((int *)((long)JVar7.ptr + 0x38))[0] = 0;
    ((int *)((long)JVar7.ptr + 0x38))[1] = 0;
    ((int *)((long)JVar7.ptr + 0x40))[0] = 0;
    ((int *)((long)JVar7.ptr + 0x40))[1] = 0;
    if ((long)piVar3[0x17] != 0) {
      pvVar8 = js_mallocz(ctx,(long)piVar3[0x17] << 3);
      if (pvVar8 == (void *)0x0) {
LAB_0013ab57:
        if ((uint)v_00.tag < 0xfffffff5) {
          return -1;
        }
        iVar5 = *JVar7.ptr;
        *(int *)JVar7.ptr = iVar5 + -1;
        if (1 < iVar5) {
          return -1;
        }
        __JS_FreeValueRT(ctx->rt,v_00);
        return -1;
      }
      *(void **)((long)JVar7.ptr + 0x38) = pvVar8;
      iVar5 = piVar3[0x17];
      if (0 < iVar5) {
        lVar9 = 0;
        do {
          bVar1 = *(byte *)(*(long *)(piVar3 + 0xe) + lVar9 * 8);
          if ((bVar1 & 1) != 0) {
            pJVar6 = js_create_module_var(ctx,bVar1 >> 3 & 1);
            if (pJVar6 == (JSVarRef *)0x0) goto LAB_0013ab57;
            *(JSVarRef **)((long)pvVar8 + lVar9 * 8) = pJVar6;
            iVar5 = piVar3[0x17];
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 < iVar5);
      }
    }
    m->func_obj = v_00;
    if ((0xfffffff4 < (uint)iVar4) && (iVar5 = *piVar3, *piVar3 = iVar5 + -1, iVar5 < 2)) {
      __JS_FreeValueRT(ctx->rt,v);
    }
  }
  else {
    iVar5 = m->export_entries_count;
    if (0 < iVar5) {
      lVar10 = 0x10;
      lVar9 = 0;
      do {
        pJVar2 = m->export_entries;
        if (*(int *)((long)&pJVar2->u + lVar10) == 0) {
          pJVar6 = js_create_module_var(ctx,0);
          if (pJVar6 == (JSVarRef *)0x0) {
            return -1;
          }
          *(JSVarRef **)((long)pJVar2 + lVar10 + -8) = pJVar6;
          iVar5 = m->export_entries_count;
        }
        lVar9 = lVar9 + 1;
        lVar10 = lVar10 + 0x20;
      } while (lVar9 < iVar5);
    }
  }
  m->field_0x81 = 1;
  if (0 < m->req_module_entries_count) {
    lVar10 = 8;
    lVar9 = 0;
    do {
      iVar5 = js_create_module_function
                        (ctx,*(JSModuleDef **)((long)&m->req_module_entries->module_name + lVar10));
      if (iVar5 < 0) {
        return -1;
      }
      lVar9 = lVar9 + 1;
      lVar10 = lVar10 + 0x10;
    } while (lVar9 < m->req_module_entries_count);
  }
  return 0;
}

Assistant:

static int js_create_module_function(JSContext *ctx, JSModuleDef *m)
{
    BOOL is_c_module;
    int i;
    JSVarRef *var_ref;
    
    if (m->func_created)
        return 0;

    is_c_module = (m->init_func != NULL);

    if (is_c_module) {
        /* initialize the exported variables */
        for(i = 0; i < m->export_entries_count; i++) {
            JSExportEntry *me = &m->export_entries[i];
            if (me->export_type == JS_EXPORT_TYPE_LOCAL) {
                var_ref = js_create_module_var(ctx, FALSE);
                if (!var_ref)
                    return -1;
                me->u.local.var_ref = var_ref;
            }
        }
    } else {
        if (js_create_module_bytecode_function(ctx, m))
            return -1;
    }
    m->func_created = TRUE;

    /* do it on the dependencies */
    
    for(i = 0; i < m->req_module_entries_count; i++) {
        JSReqModuleEntry *rme = &m->req_module_entries[i];
        if (js_create_module_function(ctx, rme->module) < 0)
            return -1;
    }

    return 0;
}